

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_mem.c
# Opt level: O0

int mem_gets(BIO *bp,char *buf,int size)

{
  int iVar1;
  int in_EDX;
  undefined1 *in_RSI;
  BIO *in_RDI;
  BUF_MEM *bm;
  BIO_BUF_MEM *bbm;
  char *p;
  int ret;
  int j;
  int i;
  BIO_METHOD *local_40;
  undefined4 uVar2;
  int iVar3;
  int local_4;
  
  uVar2 = 0xffffffff;
  local_40 = (BIO_METHOD *)in_RDI->prev_bio->callback;
  if (((ulong)in_RDI->ptr & 0x200) != 0) {
    local_40 = in_RDI->prev_bio->method;
  }
  BIO_clear_flags(in_RDI,0xf);
  iVar1 = (int)*(undefined8 *)local_40;
  if (in_EDX + -1 < iVar1) {
    iVar1 = in_EDX + -1;
  }
  if (iVar1 < 1) {
    *in_RSI = 0;
    local_4 = 0;
  }
  else {
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      if (local_40->name[iVar3] == '\n') {
        iVar3 = iVar3 + 1;
        break;
      }
    }
    local_4 = mem_read((BIO *)CONCAT44(in_EDX,iVar3),(char *)CONCAT44(iVar1,uVar2),
                       (int)((ulong)local_40->name >> 0x20));
    if (0 < local_4) {
      in_RSI[local_4] = 0;
    }
  }
  return local_4;
}

Assistant:

static int mem_gets(BIO *bp, char *buf, int size)
{
    int i, j;
    int ret = -1;
    char *p;
    BIO_BUF_MEM *bbm = (BIO_BUF_MEM *)bp->ptr;
    BUF_MEM *bm = bbm->readp;

    if (bp->flags & BIO_FLAGS_MEM_RDONLY)
        bm = bbm->buf;
    BIO_clear_retry_flags(bp);
    j = bm->length;
    if ((size - 1) < j)
        j = size - 1;
    if (j <= 0) {
        *buf = '\0';
        return 0;
    }
    p = bm->data;
    for (i = 0; i < j; i++) {
        if (p[i] == '\n') {
            i++;
            break;
        }
    }

    /*
     * i is now the max num of bytes to copy, either j or up to
     * and including the first newline
     */

    i = mem_read(bp, buf, i);
    if (i > 0)
        buf[i] = '\0';
    ret = i;
    return ret;
}